

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucm.cpp
# Opt level: O0

UBool ucm_separateMappings(UCMFile *ucm,UBool isSISO)

{
  UCMTable *table_00;
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  UCMapping *pUVar4;
  anon_union_4_2_095b93d3_for_b *local_88;
  UCMapping *local_78;
  anon_union_4_2_095b93d3_for_b *local_68;
  UCMapping *local_58;
  UBool isOK;
  UBool needsMove;
  int32_t type;
  UCMapping *mLimit;
  UCMapping *m;
  UCMTable *table;
  UBool isSISO_local;
  UCMFile *ucm_local;
  
  table_00 = ucm->base;
  mLimit = table_00->mappings;
  pUVar4 = mLimit + table_00->mappingsLength;
  bVar2 = false;
  bVar1 = true;
  for (; mLimit < pUVar4; mLimit = mLimit + 1) {
    if (((isSISO == '\0') || (mLimit->bLen != '\x01')) ||
       (((mLimit->b).bytes[0] != '\x0e' && ((mLimit->b).bytes[0] != '\x0f')))) {
      if (mLimit->uLen == '\x01') {
        local_58 = mLimit;
      }
      else {
        local_58 = (UCMapping *)(table_00->codePoints + mLimit->u);
      }
      if (mLimit->bLen < '\x05') {
        local_68 = &mLimit->b;
      }
      else {
        local_68 = (anon_union_4_2_095b93d3_for_b *)(table_00->bytes + (mLimit->b).idx);
      }
      iVar3 = ucm_mappingType(&ucm->states,mLimit,&local_58->u,local_68->bytes);
      if (iVar3 < 0) {
        if (mLimit->uLen == '\x01') {
          local_78 = mLimit;
        }
        else {
          local_78 = (UCMapping *)(table_00->codePoints + mLimit->u);
        }
        if (mLimit->bLen < '\x05') {
          local_88 = &mLimit->b;
        }
        else {
          local_88 = (anon_union_4_2_095b93d3_for_b *)(table_00->bytes + (mLimit->b).idx);
        }
        printMapping(mLimit,&local_78->u,local_88->bytes,(FILE *)_stderr);
        bVar1 = false;
      }
      else if (0 < iVar3) {
        mLimit->moveFlag = mLimit->moveFlag | 1;
        bVar2 = true;
      }
    }
    else {
      fprintf(_stderr,"warning: removing illegal mapping from an SI/SO-stateful table\n");
      ucm_printMapping(table_00,mLimit,(FILE *)_stderr);
      mLimit->moveFlag = mLimit->moveFlag | 2;
      bVar2 = true;
    }
  }
  if (bVar1) {
    if (bVar2) {
      ucm_moveMappings(ucm->base,ucm->ext);
      ucm_local._7_1_ = ucm_checkBaseExt(&ucm->states,ucm->base,ucm->ext,ucm->ext,'\0');
    }
    else {
      ucm_sortTable(ucm->base);
      ucm_local._7_1_ = '\x01';
    }
  }
  else {
    ucm_local._7_1_ = '\0';
  }
  return ucm_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
ucm_separateMappings(UCMFile *ucm, UBool isSISO) {
    UCMTable *table;
    UCMapping *m, *mLimit;
    int32_t type;
    UBool needsMove, isOK;

    table=ucm->base;
    m=table->mappings;
    mLimit=m+table->mappingsLength;

    needsMove=FALSE;
    isOK=TRUE;

    for(; m<mLimit; ++m) {
        if(isSISO && m->bLen==1 && (m->b.bytes[0]==0xe || m->b.bytes[0]==0xf)) {
            fprintf(stderr, "warning: removing illegal mapping from an SI/SO-stateful table\n");
            ucm_printMapping(table, m, stderr);
            m->moveFlag|=UCM_REMOVE_MAPPING;
            needsMove=TRUE;
            continue;
        }

        type=ucm_mappingType(
                &ucm->states, m,
                UCM_GET_CODE_POINTS(table, m), UCM_GET_BYTES(table, m));
        if(type<0) {
            /* illegal byte sequence */
            printMapping(m, UCM_GET_CODE_POINTS(table, m), UCM_GET_BYTES(table, m), stderr);
            isOK=FALSE;
        } else if(type>0) {
            m->moveFlag|=UCM_MOVE_TO_EXT;
            needsMove=TRUE;
        }
    }

    if(!isOK) {
        return FALSE;
    }
    if(needsMove) {
        ucm_moveMappings(ucm->base, ucm->ext);
        return ucm_checkBaseExt(&ucm->states, ucm->base, ucm->ext, ucm->ext, FALSE);
    } else {
        ucm_sortTable(ucm->base);
        return TRUE;
    }
}